

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O2

void __thiscall RDNSequence::Encode(RDNSequence *this,uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  pointer pRVar1;
  size_t sVar2;
  size_t item;
  ulong uVar3;
  long lVar4;
  uchar *pOut_00;
  undefined1 auStack_58 [8];
  EncodeHelper eh;
  
  auStack_58 = (undefined1  [8])0x0;
  eh.offset = 0;
  eh.cbNeeded = 0;
  eh.cbCurrent = (size_t)cbUsed;
  sVar2 = DerBase::EncodedSize(&this->super_DerBase);
  EncodeHelper::Init((EncodeHelper *)auStack_58,sVar2,pOut,cbOut,'0',(this->super_DerBase).cbData);
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    pRVar1 = (this->name).
             super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->name).
                       super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x28) <= uVar3)
    break;
    pOut_00 = pOut + (long)auStack_58;
    sVar2 = EncodeHelper::DataSize((EncodeHelper *)auStack_58);
    RelativeDistinguishedName::Encode
              ((RelativeDistinguishedName *)((long)&(pRVar1->super_DerBase)._vptr_DerBase + lVar4),
               pOut_00,sVar2,&eh.cbNeeded);
    auStack_58 = (undefined1  [8])((long)auStack_58 + eh.cbNeeded);
    eh.cbNeeded = 0;
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x28;
  }
  EncodeHelper::Finalize((EncodeHelper *)auStack_58);
  return;
}

Assistant:

virtual void Encode(unsigned char* pOut, size_t cbOut, size_t& cbUsed) override
	{
        EncodeHelper eh(cbUsed);

        eh.Init(EncodedSize(), pOut, cbOut, static_cast<unsigned char>(DerType::ConstructedSequence), cbData);

        // This is a sequence of sets of AttributeTypeAndValue
        for (size_t item = 0; item < name.size(); ++item)
        {
            name[item].Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
            eh.Update();
        }

		eh.Finalize();
	}